

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_nameMatchesAscii(ENCODING *enc,char *ptr1,char *end1,char *ptr2)

{
  char *pcVar1;
  char cVar2;
  
  cVar2 = *ptr2;
  if (cVar2 != '\0') {
    pcVar1 = ptr2 + 1;
    do {
      if (ptr1 == end1) {
        return 0;
      }
      if (ptr1[1] != '\0') {
        return 0;
      }
      if (*ptr1 != cVar2) {
        return 0;
      }
      ptr1 = ptr1 + 2;
      cVar2 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (cVar2 != '\0');
  }
  return (uint)(ptr1 == end1);
}

Assistant:

static
int PREFIX(nameMatchesAscii)(const ENCODING *enc, const char *ptr1,
                             const char *end1, const char *ptr2)
{
  cmExpatUnused(enc);
  for (; *ptr2; ptr1 += MINBPC(enc), ptr2++) {
    if (ptr1 == end1)
      return 0;
    if (!CHAR_MATCHES(enc, ptr1, *ptr2))
      return 0;
  }
  return ptr1 == end1;
}